

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int stbtt_GetNumberOfFonts(uchar *data)

{
  int iVar1;
  stbtt_uint32 sVar2;
  stbtt_int32 sVar3;
  int iVar4;
  
  iVar1 = stbtt__isfont(data);
  if (iVar1 == 0) {
    iVar4 = 0;
    iVar1 = 0;
    if ((((*data == 't') && (iVar1 = iVar4, data[1] == 't')) && (data[2] == 'c')) &&
       (data[3] == 'f')) {
      sVar2 = ttULONG(data + 4);
      if ((sVar2 == 0x20000) || (sVar2 == 0x10000)) {
        sVar3 = ttLONG(data + 8);
        return sVar3;
      }
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_GetNumberOfFonts(const unsigned char *data)
{
return stbtt_GetNumberOfFonts_internal((unsigned char *) data);
}